

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ResultError(sqlite3_context *pCtx,char *zFmt,...)

{
  long lVar1;
  char *in_RCX;
  __va_list_tag *in_RDX;
  long in_FS_OFFSET;
  char *zErr;
  va_list ap;
  char *in_stack_ffffffffffffff08;
  sqlite3_context *in_stack_ffffffffffffff10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sqlite3_vmprintf(in_RCX,in_RDX);
  sqlite3_result_error(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,0);
  sqlite3_free((void *)0x28cc83);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts5ResultError(sqlite3_context *pCtx, const char *zFmt, ...){
  char *zErr = 0;
  va_list ap;
  va_start(ap, zFmt);
  zErr = sqlite3_vmprintf(zFmt, ap);
  sqlite3_result_error(pCtx, zErr, -1);
  sqlite3_free(zErr);
  va_end(ap);
}